

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O2

Self * __thiscall
draco::PointAttributeVectorOutputIterator<float>::operator=
          (PointAttributeVectorOutputIterator<float> *this,VectorD<float,_3> *val)

{
  pointer ptVar1;
  PointAttribute *pPVar2;
  size_t __n;
  ulong uVar3;
  
  ptVar1 = (this->attributes_).
           super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (ptVar1->
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
           ).super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  uVar3 = (ulong)(this->point_id_).value_;
  if (pPVar2->identity_mapping_ == false) {
    uVar3 = (ulong)*(uint *)(*(long *)&(pPVar2->indices_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                       ._M_impl + uVar3 * 4);
  }
  if ((uint)uVar3 < pPVar2->num_unique_entries_) {
    __n = (pPVar2->super_GeometryAttribute).byte_stride_;
    memcpy((void *)(uVar3 * __n + *(long *)&((pPVar2->super_GeometryAttribute).buffer_)->data_),
           (val->v_)._M_elems +
           (ptVar1->
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
           ).super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
           super__Head_base<1UL,_unsigned_int,_false>._M_head_impl,__n);
  }
  return this;
}

Assistant:

const Self &operator=(const VectorD<CoeffT, 3> &val) {
    DRACO_DCHECK_EQ(attributes_.size(), 1);  // Expect only ONE attribute.
    AttributeTuple &att = attributes_[0];
    PointAttribute *attribute = std::get<0>(att);
    const AttributeValueIndex avi = attribute->mapped_index(point_id_);
    if (avi >= static_cast<uint32_t>(attribute->size())) {
      return *this;
    }
    const uint32_t &offset = std::get<1>(att);
    DRACO_DCHECK_EQ(offset, 0);  // expected to be zero
    attribute->SetAttributeValue(avi, &val[0] + offset);
    return *this;
  }